

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix * __thiscall maths::Matrix::operator-=(Matrix *this,Matrix *m)

{
  double **ppdVar1;
  double **ppdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int j;
  ulong uVar6;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)this->cols_;
  if (this->cols_ < 1) {
    uVar3 = uVar4;
  }
  uVar5 = (ulong)(uint)this->rows_;
  if (this->rows_ < 1) {
    uVar5 = uVar4;
  }
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    ppdVar1 = m->p;
    ppdVar2 = this->p;
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      ppdVar2[uVar4][uVar6] = ppdVar2[uVar4][uVar6] - ppdVar1[uVar4][uVar6];
    }
  }
  return this;
}

Assistant:

Matrix& Matrix::operator-=(const Matrix& m)
{
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            p[i][j] -= m.p[i][j];
        }
    }
    return *this;
}